

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surveyor.c
# Opt level: O3

int nn_surveyor_getopt(nn_sockbase *self,int level,int option,void *optval,size_t *optvallen)

{
  int iVar1;
  
  if (option == 1 && level == 0x62) {
    if (3 < *optvallen) {
      *(undefined4 *)optval = *(undefined4 *)&self[0x35].sock;
      *optvallen = 4;
      return 0;
    }
    iVar1 = -0x16;
  }
  else {
    iVar1 = -0x5c;
  }
  return iVar1;
}

Assistant:

static int nn_surveyor_getopt (struct nn_sockbase *self, int level, int option,
    void *optval, size_t *optvallen)
{
    struct nn_surveyor *surveyor;

    surveyor = nn_cont (self, struct nn_surveyor, xsurveyor.sockbase);

    if (level != NN_SURVEYOR)
        return -ENOPROTOOPT;

    if (option == NN_SURVEYOR_DEADLINE) {
        if (nn_slow (*optvallen < sizeof (int)))
            return -EINVAL;
        *(int*) optval = surveyor->deadline;
        *optvallen = sizeof (int);
        return 0;
    }

    return -ENOPROTOOPT;
}